

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

bool getIndexed(Image *output,vector<unsigned_char,_std::allocator<unsigned_char>_> *input,Size size
               ,bool isSwitch,int colors)

{
  pointer *ppCVar1;
  uint8_t uVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  pointer pCVar5;
  ulong uVar6;
  Color *color;
  pointer pCVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  Color *pCVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  vector<Color,_std::allocator<Color>_> table;
  allocator_type local_4d;
  undefined4 local_4c;
  void *local_48 [2];
  long local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,isSwitch);
  iVar14 = size.width;
  iVar12 = size.height * iVar14;
  pCVar9 = (Color *)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(colors << 2);
  std::vector<Color,std::allocator<Color>>::vector<Color*,void>
            ((vector<Color,std::allocator<Color>> *)local_48,pCVar9,(Color *)(&pCVar9->r + lVar10),
             &local_4d);
  output->size = size;
  pCVar7 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar7) {
    (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar7;
  }
  uVar13 = (ulong)(iVar12 + colors * 4);
  if (0 < iVar12) {
    do {
      pCVar9 = (Color *)((ulong)(input->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start[lVar10] * 4 +
                        (long)local_48[0]);
      __position._M_current =
           (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Color,std::allocator<Color>>::_M_realloc_insert<Color_const&>
                  ((vector<Color,std::allocator<Color>> *)&output->colorData,__position,pCVar9);
      }
      else {
        *__position._M_current = *pCVar9;
        ppCVar1 = &(output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)uVar13);
  }
  puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar3;
  if (uVar13 < uVar11) {
    iVar12 = (output->size).width;
    pCVar7 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      uVar6 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      pCVar7[(int)((long)uVar6 / (long)iVar14) * iVar12 + (int)((long)uVar6 % (long)iVar14)].a =
           puVar3[uVar8 + uVar13];
      lVar10 = uVar8 + uVar13;
      uVar8 = uVar8 + 1;
    } while (lVar10 + 1U < uVar11);
  }
  if ((char)local_4c == '\0') {
    pCVar5 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar7 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar7 != pCVar5; pCVar7 = pCVar7 + 1) {
      uVar2 = pCVar7->b;
      pCVar7->b = pCVar7->r;
      pCVar7->r = uVar2;
    }
  }
  puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return (long)puVar4 - (long)puVar3 != uVar13;
}

Assistant:

bool getIndexed(Image &output, const std::vector<uint8_t> &input, Size size, bool isSwitch, int colors) {
	assert(input.size() >= colors * 4 + size.area());
	int imgStart = colors * 4;
	int maskStart = imgStart + size.area();
	std::vector<Color> table((Color *)&input[0], (Color *)&input[imgStart]);

	output.size = size;
	output.colorData.clear();
	for (int i = imgStart; i < maskStart; i++) {
		output.colorData.push_back(table[input[i]]);
	}
	for (int i = maskStart; i < input.size(); i++) {
		int x = (i - maskStart) % size.width;
		int y = (i - maskStart) / size.width;
		output.pixel(x, y).a = input[i];
	}

	if (!isSwitch) { swapBR(output); }
	return maskStart != input.size();
}